

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall
Catch::Clara::Detail::BasicResult<Catch::Clara::Detail::ParseState>::
BasicResult<Catch::Clara::ParseResultType>
          (BasicResult<Catch::Clara::Detail::ParseState> *this,
          BasicResult<Catch::Clara::ParseResultType> *other)

{
  string *psVar1;
  BasicResult<Catch::Clara::ParseResultType> *in_RSI;
  undefined8 *in_RDI;
  ResultValueBase<Catch::Clara::Detail::ParseState> *in_stack_ffffffffffffffd0;
  string *this_00;
  
  Detail::BasicResult<Catch::Clara::ParseResultType>::type(in_RSI);
  ResultValueBase<Catch::Clara::Detail::ParseState>::ResultValueBase
            (in_stack_ffffffffffffffd0,(ResultType)((ulong)in_RDI >> 0x20));
  *in_RDI = &PTR__BasicResult_002a9288;
  this_00 = (string *)(in_RDI + 8);
  psVar1 = Detail::BasicResult<Catch::Clara::ParseResultType>::errorMessage_abi_cxx11_(in_RSI);
  std::__cxx11::string::string(this_00,(string *)psVar1);
  return;
}

Assistant:

explicit BasicResult( BasicResult<U> const& other ):
                    ResultValueBase<T>( other.type() ),
                    m_errorMessage( other.errorMessage() ) {
                    assert( type() != ResultType::Ok );
                }